

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variablebyte.cpp
# Opt level: O2

void __thiscall
FastPForLib::VariableByteTest_sequenceHasBoth32And64_Test::
VariableByteTest_sequenceHasBoth32And64_Test(VariableByteTest_sequenceHasBoth32And64_Test *this)

{
  VariableByteTest::VariableByteTest(&this->super_VariableByteTest);
  (this->super_VariableByteTest).super_Test._vptr_Test =
       (_func_int **)&PTR__VariableByteTest_001a7a48;
  return;
}

Assistant:

TEST_F(VariableByteTest, sequenceHasBoth32And64) {
    in64.resize(0);
    in64.push_back(-9223372036854775000);
    in64.push_back(-32767);
    in64.push_back(-300);
    in64.push_back(0);
    in64.push_back(500);
    in64.push_back(32767);
    in64.push_back(65536);
    in64.push_back(2147483647);
    in64.push_back(4294967295);
    in64.push_back(8223372036854775800);
    _verify64();
  }